

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O2

int pzshape::TPZShapePiram::NConnectShapeF(int side,int order)

{
  int totsum;
  ostream *poVar1;
  int iVar2;
  int iVar3;
  
  if (4 < side) {
    if ((uint)side < 0xd) {
      iVar3 = order + -1;
    }
    else if (side == 0xd) {
      iVar3 = (order + -1) * (order + -1);
    }
    else if ((uint)side < 0x12) {
      iVar3 = ((order + -1) * (order + -2)) / 2;
    }
    else if (side == 0x12) {
      iVar3 = 0;
      for (iVar2 = 2; iVar2 + -1 < order + -1; iVar2 = iVar2 + 1) {
        iVar3 = iVar3 + ((uint)((iVar2 + -1) * iVar2) >> 1);
      }
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "TPZShapePiram::NConnectShapeF, bad parameter side ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
      std::endl<char,std::char_traits<char>>(poVar1);
      iVar3 = 0;
    }
    return iVar3;
  }
  return 1;
}

Assistant:

int TPZShapePiram::NConnectShapeF(int side, int order) {
		if(side<5) return 1;//0 a 4
		//   int s = side-5;//s = 0 a 14 ou side = 6 a 20
		if(side<13) return (order-1);//6 a 14
		if(side==13) {
			return ((order-1)*(order-1));
		}
		if(side<18) {//16,17,18
			return ((order-2)*(order-1)/2);
		}
		if(side==18) {
			int totsum = 0,sum;
			for(int i=1;i<order-1;i++) {
				sum = i*(i+1) / 2;
				totsum += sum;
			}
			return totsum;
		}
		PZError << "TPZShapePiram::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}